

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kv_instance.cc
# Opt level: O0

void fdb_file_handle_close_all(fdb_file_handle *fhandle)

{
  list_elem *plVar1;
  fdb_kvs_handle *in_RDI;
  kvs_opened_node *node;
  list_elem *e;
  list_elem *local_10;
  
  pthread_spin_lock((pthread_spinlock_t *)&in_RDI->op_stats);
  local_10 = list_begin((list *)(in_RDI->kvs_config).custom_cmp);
  while (local_10 != (list_elem *)0x0) {
    plVar1 = local_10 + -1;
    local_10 = list_next(local_10);
    _fdb_close(in_RDI);
    free(plVar1->next);
    free(&plVar1->next);
  }
  pthread_spin_unlock((pthread_spinlock_t *)&in_RDI->op_stats);
  return;
}

Assistant:

void fdb_file_handle_close_all(fdb_file_handle *fhandle)
{
    struct list_elem *e;
    struct kvs_opened_node *node;

    spin_lock(&fhandle->lock);
    e = list_begin(fhandle->handles);
    while (e) {
        node = _get_entry(e, struct kvs_opened_node, le);
        e = list_next(e);
        _fdb_close(node->handle);
        free(node->handle);
        free(node);
    }
    spin_unlock(&fhandle->lock);
}